

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_compressBlock_fast_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *iEnd;
  BYTE *pBVar2;
  undefined8 *puVar3;
  uint uVar4;
  uint uVar5;
  U32 UVar6;
  ZSTD_matchState_t *pZVar7;
  U32 *pUVar8;
  BYTE *pBVar9;
  ulong *mEnd;
  BYTE *pBVar10;
  U32 *pUVar11;
  undefined8 uVar12;
  char cVar13;
  char cVar14;
  uint uVar15;
  size_t sVar16;
  BYTE *pBVar17;
  byte bVar18;
  int iVar19;
  uint uVar20;
  ulong *puVar21;
  BYTE *pBVar22;
  ulong *puVar23;
  ulong *puVar24;
  ulong uVar25;
  ulong *puVar26;
  ulong *puVar27;
  uint uVar28;
  int iVar29;
  uint uVar30;
  long lVar31;
  long lVar32;
  int *piVar33;
  ulong uVar34;
  uint uVar35;
  ulong uVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  BYTE *iStart;
  int iVar41;
  seqDef *psVar42;
  U32 UVar43;
  ulong *puVar44;
  ulong *puVar45;
  ulong uVar46;
  U32 prefixStartIndex;
  BYTE *iend;
  U32 dictIndexDelta;
  U32 hlog;
  BYTE *base;
  BYTE *ilimit;
  BYTE *prefixStart;
  BYTE *dictBase;
  BYTE *dictEnd;
  U32 *hashTable;
  BYTE *dictStart;
  U32 *dictHashTable;
  U32 dictStartIndex;
  ulong *local_108;
  
  pZVar7 = ms->dictMatchState;
  if (pZVar7 == (ZSTD_matchState_t *)0x0) {
    __assert_fail("ms->dictMatchState != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x3e4d,
                  "size_t ZSTD_compressBlock_fast_dictMatchState(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t)"
                 );
  }
  uVar20 = (ms->cParams).minMatch;
  pUVar8 = ms->hashTable;
  uVar15 = (ms->cParams).targetLength;
  uVar15 = uVar15 + (uVar15 == 0);
  pBVar9 = (ms->window).base;
  uVar4 = (ms->window).dictLimit;
  iStart = pBVar9 + uVar4;
  iEnd = (ulong *)((long)src + srcSize);
  puVar21 = (ulong *)((long)src + (srcSize - 8));
  uVar5 = (pZVar7->window).dictLimit;
  mEnd = (ulong *)(pZVar7->window).nextSrc;
  pBVar10 = (pZVar7->window).base;
  pBVar22 = pBVar10 + uVar5;
  uVar35 = (int)mEnd - (int)pBVar10;
  uVar28 = uVar4 - uVar35;
  iVar29 = ((int)src - (int)iStart) + (int)mEnd;
  iVar19 = (int)pBVar22;
  uVar30 = iVar29 - iVar19;
  uVar37 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  pUVar11 = pZVar7->hashTable;
  iVar41 = (int)pBVar9;
  uVar38 = ((int)iEnd - iVar41) - uVar4;
  uVar39 = *rep;
  uVar40 = rep[1];
  cVar13 = (char)(ms->cParams).hashLog;
  cVar14 = (char)(pZVar7->cParams).hashLog;
  puVar27 = (ulong *)src;
  if (uVar20 == 5) {
    if (uVar37 < uVar38) goto LAB_00140d9f;
    if (uVar4 < uVar35) goto LAB_00140dbe;
    if (uVar30 < uVar39) goto LAB_00140ddd;
    puVar44 = (ulong *)((long)src + (ulong)(iVar29 == iVar19));
    if (uVar30 < uVar40) goto LAB_00140dfc;
    if (puVar44 < puVar21) {
      bVar18 = 0x40 - cVar13;
      puVar1 = iEnd + -4;
      do {
        uVar46 = *puVar44;
        uVar36 = uVar46 * -0x30e4432345000000 >> (bVar18 & 0x3f);
        uVar25 = (long)puVar44 - (long)pBVar9;
        UVar43 = (U32)uVar25;
        uVar20 = (UVar43 - uVar39) + 1;
        piVar33 = (int *)(pBVar9 + uVar20);
        if (uVar20 < uVar4) {
          piVar33 = (int *)(pBVar10 + (uVar20 - uVar28));
        }
        uVar30 = pUVar8[uVar36];
        uVar34 = (ulong)uVar30;
        pUVar8[uVar36] = UVar43;
        if (((uVar4 - 1) - uVar20 < 3) || (*piVar33 != *(int *)((long)puVar44 + 1))) {
          local_108 = puVar44;
          if (uVar30 <= uVar4) {
            uVar20 = pUVar11[uVar46 * -0x30e4432345000000 >> (0x40U - cVar14 & 0x3f)];
            if ((uVar20 <= uVar5) || (*(int *)(pBVar10 + uVar20) != (int)*puVar44))
            goto LAB_0013fb0b;
            sVar16 = ZSTD_count_2segments
                               ((BYTE *)((long)puVar44 + 4),(BYTE *)((long)(pBVar10 + uVar20) + 4),
                                (BYTE *)iEnd,(BYTE *)mEnd,iStart);
            lVar31 = sVar16 + 4;
            if (puVar27 < puVar44) {
              pBVar17 = pBVar10 + ((ulong)uVar20 - 1);
              do {
                puVar45 = (ulong *)((long)puVar44 + -1);
                local_108 = puVar44;
                if ((*(BYTE *)puVar45 != *pBVar17) ||
                   (lVar31 = lVar31 + 1, local_108 = puVar45, pBVar17 <= pBVar22)) break;
                pBVar17 = pBVar17 + -1;
                puVar44 = puVar45;
              } while (puVar27 < puVar45);
            }
            if ((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3) <
                seqStore->maxNbSeq) {
              if (seqStore->maxNbLit < 0x20001) {
                uVar46 = (long)local_108 - (long)puVar27;
                puVar44 = (ulong *)seqStore->lit;
                if ((BYTE *)((long)puVar44 + uVar46) <= seqStore->litStart + seqStore->maxNbLit) {
                  if (local_108 <= iEnd) {
                    if (puVar1 < local_108) {
                      ZSTD_safecopyLiterals
                                ((BYTE *)puVar44,(BYTE *)puVar27,(BYTE *)local_108,(BYTE *)puVar1);
LAB_0013fe44:
                      seqStore->lit = seqStore->lit + uVar46;
                      if (0xffff < uVar46) {
                        if (seqStore->longLengthID != 0) goto LAB_00140d23;
                        seqStore->longLengthID = 1;
                        seqStore->longLengthPos =
                             (U32)((ulong)((long)seqStore->sequences -
                                          (long)seqStore->sequencesStart) >> 3);
                      }
                    }
                    else {
                      uVar36 = puVar27[1];
                      *puVar44 = *puVar27;
                      puVar44[1] = uVar36;
                      pBVar17 = seqStore->lit;
                      if (0x10 < uVar46) {
                        lVar32 = (long)(pBVar17 + 0x10) - (long)(puVar27 + 2);
                        if (lVar32 < 8) {
                          if (-0x10 < lVar32) goto LAB_00140d42;
                        }
                        else if (0xffffffffffffffe0 < lVar32 - 0x10U) goto LAB_00140d61;
                        uVar36 = puVar27[3];
                        *(ulong *)(pBVar17 + 0x10) = puVar27[2];
                        *(ulong *)(pBVar17 + 0x18) = uVar36;
                        if (0x20 < (long)uVar46) {
                          lVar32 = 0;
                          do {
                            puVar3 = (undefined8 *)((long)puVar27 + lVar32 + 0x20);
                            uVar12 = puVar3[1];
                            pBVar2 = pBVar17 + lVar32 + 0x20;
                            *(undefined8 *)pBVar2 = *puVar3;
                            *(undefined8 *)(pBVar2 + 8) = uVar12;
                            puVar3 = (undefined8 *)((long)puVar27 + lVar32 + 0x30);
                            uVar12 = puVar3[1];
                            *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
                            *(undefined8 *)(pBVar2 + 0x18) = uVar12;
                            lVar32 = lVar32 + 0x20;
                          } while (pBVar2 + 0x20 < pBVar17 + uVar46);
                        }
                        goto LAB_0013fe44;
                      }
                      seqStore->lit = pBVar17 + uVar46;
                    }
                    uVar20 = UVar43 - (uVar20 + uVar28);
                    uVar36 = lVar31 - 3;
                    psVar42 = seqStore->sequences;
                    psVar42->litLength = (U16)uVar46;
                    psVar42->offset = uVar20 + 3;
                    uVar40 = uVar39;
                    if (0xffff < uVar36) {
                      UVar6 = seqStore->longLengthID;
                      goto LAB_0013ff57;
                    }
                    goto LAB_0013ff85;
                  }
                  goto LAB_00140ca7;
                }
                goto LAB_00140c88;
              }
              goto LAB_00140cc6;
            }
            goto LAB_00140c69;
          }
          piVar33 = (int *)(pBVar9 + uVar34);
          if (*piVar33 == (int)*puVar44) {
            puVar45 = (ulong *)((long)puVar44 + 4);
            puVar23 = (ulong *)(piVar33 + 1);
            puVar24 = puVar45;
            if (puVar45 < (ulong *)((long)iEnd - 7U)) {
              if (*puVar23 == *puVar45) {
                lVar31 = 0;
                do {
                  puVar23 = (ulong *)((long)puVar44 + lVar31 + 0xc);
                  if ((ulong *)((long)iEnd - 7U) <= puVar23) {
                    puVar23 = (ulong *)(pBVar9 + lVar31 + uVar34 + 0xc);
                    puVar24 = (ulong *)((long)puVar44 + lVar31 + 0xc);
                    goto LAB_0013fc1f;
                  }
                  lVar32 = lVar31 + uVar34 + 0xc;
                  uVar46 = *puVar23;
                  lVar31 = lVar31 + 8;
                } while (*(ulong *)(pBVar9 + lVar32) == uVar46);
                uVar46 = uVar46 ^ *(ulong *)(pBVar9 + lVar32);
                uVar36 = 0;
                if (uVar46 != 0) {
                  for (; (uVar46 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
                  }
                }
                uVar46 = (uVar36 >> 3 & 0x1fffffff) + lVar31;
              }
              else {
                uVar36 = *puVar45 ^ *puVar23;
                uVar46 = 0;
                if (uVar36 != 0) {
                  for (; (uVar36 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
                  }
                }
                uVar46 = uVar46 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_0013fc1f:
              if ((puVar24 < (ulong *)((long)iEnd - 3U)) && ((int)*puVar23 == (int)*puVar24)) {
                puVar24 = (ulong *)((long)puVar24 + 4);
                puVar23 = (ulong *)((long)puVar23 + 4);
              }
              if ((puVar24 < (ulong *)((long)iEnd + -1)) && ((short)*puVar23 == (short)*puVar24)) {
                puVar24 = (ulong *)((long)puVar24 + 2);
                puVar23 = (ulong *)((long)puVar23 + 2);
              }
              if (puVar24 < iEnd) {
                puVar24 = (ulong *)((long)puVar24 + (ulong)((BYTE)*puVar23 == (BYTE)*puVar24));
              }
              uVar46 = (long)puVar24 - (long)puVar45;
            }
            lVar31 = uVar46 + 4;
            if (puVar27 < puVar44) {
              pBVar17 = pBVar9 + (uVar34 - 1);
              do {
                puVar45 = (ulong *)((long)local_108 + -1);
                if ((*(BYTE *)puVar45 != *pBVar17) ||
                   (lVar31 = lVar31 + 1, local_108 = puVar45, pBVar17 <= iStart)) break;
                pBVar17 = pBVar17 + -1;
              } while (puVar27 < puVar45);
            }
            if ((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3) <
                seqStore->maxNbSeq) {
              if (seqStore->maxNbLit < 0x20001) {
                uVar46 = (long)local_108 - (long)puVar27;
                puVar45 = (ulong *)seqStore->lit;
                if ((BYTE *)((long)puVar45 + uVar46) <= seqStore->litStart + seqStore->maxNbLit) {
                  if (local_108 <= iEnd) {
                    if (puVar1 < local_108) {
                      ZSTD_safecopyLiterals
                                ((BYTE *)puVar45,(BYTE *)puVar27,(BYTE *)local_108,(BYTE *)puVar1);
LAB_0013fd1b:
                      seqStore->lit = seqStore->lit + uVar46;
                      if (0xffff < uVar46) {
                        if (seqStore->longLengthID != 0) goto LAB_00140d23;
                        seqStore->longLengthID = 1;
                        seqStore->longLengthPos =
                             (U32)((ulong)((long)seqStore->sequences -
                                          (long)seqStore->sequencesStart) >> 3);
                      }
                    }
                    else {
                      uVar36 = puVar27[1];
                      *puVar45 = *puVar27;
                      puVar45[1] = uVar36;
                      pBVar17 = seqStore->lit;
                      if (0x10 < uVar46) {
                        lVar32 = (long)(pBVar17 + 0x10) - (long)(puVar27 + 2);
                        if (lVar32 < 8) {
                          if (-0x10 < lVar32) goto LAB_00140d42;
                        }
                        else if (0xffffffffffffffe0 < lVar32 - 0x10U) goto LAB_00140d61;
                        uVar36 = puVar27[3];
                        *(ulong *)(pBVar17 + 0x10) = puVar27[2];
                        *(ulong *)(pBVar17 + 0x18) = uVar36;
                        if (0x20 < (long)uVar46) {
                          lVar32 = 0;
                          do {
                            puVar3 = (undefined8 *)((long)puVar27 + lVar32 + 0x20);
                            uVar12 = puVar3[1];
                            pBVar2 = pBVar17 + lVar32 + 0x20;
                            *(undefined8 *)pBVar2 = *puVar3;
                            *(undefined8 *)(pBVar2 + 8) = uVar12;
                            puVar3 = (undefined8 *)((long)puVar27 + lVar32 + 0x30);
                            uVar12 = puVar3[1];
                            *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
                            *(undefined8 *)(pBVar2 + 0x18) = uVar12;
                            lVar32 = lVar32 + 0x20;
                          } while (pBVar2 + 0x20 < pBVar17 + uVar46);
                        }
                        goto LAB_0013fd1b;
                      }
                      seqStore->lit = pBVar17 + uVar46;
                    }
                    uVar20 = (int)puVar44 - (int)piVar33;
                    uVar36 = lVar31 - 3;
                    psVar42 = seqStore->sequences;
                    psVar42->litLength = (U16)uVar46;
                    psVar42->offset = uVar20 + 3;
                    uVar40 = uVar39;
                    if (uVar36 < 0x10000) goto LAB_0013ff85;
                    if (seqStore->longLengthID == 0) goto LAB_0013ff62;
                    goto LAB_00140ce5;
                  }
                  goto LAB_00140ca7;
                }
                goto LAB_00140c88;
              }
              goto LAB_00140cc6;
            }
            goto LAB_00140c69;
          }
LAB_0013fb0b:
          puVar44 = (ulong *)((long)puVar44 + ((long)puVar44 - (long)puVar27 >> 8) + (ulong)uVar15);
        }
        else {
          puVar45 = iEnd;
          if (uVar20 < uVar4) {
            puVar45 = mEnd;
          }
          sVar16 = ZSTD_count_2segments
                             ((BYTE *)((long)puVar44 + 5),(BYTE *)(piVar33 + 1),(BYTE *)iEnd,
                              (BYTE *)puVar45,iStart);
          if (seqStore->maxNbSeq <=
              (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
          goto LAB_00140c69;
          if (0x20000 < seqStore->maxNbLit) goto LAB_00140cc6;
          local_108 = (ulong *)((long)puVar44 + 1);
          uVar46 = (long)local_108 - (long)puVar27;
          puVar44 = (ulong *)seqStore->lit;
          if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar44 + uVar46))
          goto LAB_00140c88;
          if (iEnd < local_108) goto LAB_00140ca7;
          if (puVar1 < local_108) {
            ZSTD_safecopyLiterals((BYTE *)puVar44,(BYTE *)puVar27,(BYTE *)local_108,(BYTE *)puVar1);
LAB_0013f992:
            seqStore->lit = seqStore->lit + uVar46;
            if (0xffff < uVar46) {
              if (seqStore->longLengthID != 0) goto LAB_00140d23;
              seqStore->longLengthID = 1;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
            }
          }
          else {
            uVar36 = puVar27[1];
            *puVar44 = *puVar27;
            puVar44[1] = uVar36;
            pBVar17 = seqStore->lit;
            if (0x10 < uVar46) {
              lVar31 = (long)(pBVar17 + 0x10) - (long)(puVar27 + 2);
              if (lVar31 < 8) {
                if (-0x10 < lVar31) goto LAB_00140d42;
              }
              else if (0xffffffffffffffe0 < lVar31 - 0x10U) goto LAB_00140d61;
              uVar36 = puVar27[3];
              *(ulong *)(pBVar17 + 0x10) = puVar27[2];
              *(ulong *)(pBVar17 + 0x18) = uVar36;
              if (0x20 < (long)uVar46) {
                lVar31 = 0;
                do {
                  puVar3 = (undefined8 *)((long)puVar27 + lVar31 + 0x20);
                  uVar12 = puVar3[1];
                  pBVar2 = pBVar17 + lVar31 + 0x20;
                  *(undefined8 *)pBVar2 = *puVar3;
                  *(undefined8 *)(pBVar2 + 8) = uVar12;
                  puVar3 = (undefined8 *)((long)puVar27 + lVar31 + 0x30);
                  uVar12 = puVar3[1];
                  *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
                  *(undefined8 *)(pBVar2 + 0x18) = uVar12;
                  lVar31 = lVar31 + 0x20;
                } while (pBVar2 + 0x20 < pBVar17 + uVar46);
              }
              goto LAB_0013f992;
            }
            seqStore->lit = pBVar17 + uVar46;
          }
          lVar31 = sVar16 + 4;
          uVar36 = sVar16 + 1;
          psVar42 = seqStore->sequences;
          psVar42->litLength = (U16)uVar46;
          psVar42->offset = 1;
          uVar20 = uVar39;
          if (0xffff < uVar36) {
            UVar6 = seqStore->longLengthID;
LAB_0013ff57:
            uVar39 = uVar40;
            if (UVar6 != 0) goto LAB_00140ce5;
LAB_0013ff62:
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar42 - (long)seqStore->sequencesStart) >> 3);
            uVar40 = uVar39;
          }
LAB_0013ff85:
          uVar39 = uVar20;
          puVar27 = (ulong *)(lVar31 + (long)local_108);
          psVar42->matchLength = (U16)uVar36;
          psVar42 = psVar42 + 1;
          seqStore->sequences = psVar42;
          puVar44 = puVar27;
          if (puVar27 <= puVar21) {
            if (pBVar9 + (uVar25 & 0xffffffff) + 2 <= src) goto LAB_00140d04;
            pUVar8[(ulong)(*(long *)(pBVar9 + (uVar25 & 0xffffffff) + 2) * -0x30e4432345000000) >>
                   (bVar18 & 0x3f)] = UVar43 + 2;
            pUVar8[(ulong)(*(long *)((long)puVar27 + -2) * -0x30e4432345000000) >> (bVar18 & 0x3f)]
                 = ((int)puVar27 + -2) - iVar41;
            do {
              uVar30 = uVar39;
              UVar43 = (int)puVar27 - iVar41;
              uVar20 = UVar43 - uVar40;
              pBVar17 = pBVar9;
              if (uVar20 < uVar4) {
                pBVar17 = pBVar10 + -(ulong)uVar28;
              }
              puVar44 = puVar27;
              uVar39 = uVar30;
              if (((uVar4 - 1) - uVar20 < 3) || (*(int *)(pBVar17 + uVar20) != (int)*puVar27))
              break;
              puVar44 = iEnd;
              if (uVar20 < uVar4) {
                puVar44 = mEnd;
              }
              sVar16 = ZSTD_count_2segments
                                 ((BYTE *)((long)puVar27 + 4),(BYTE *)((long)(pBVar17 + uVar20) + 4)
                                  ,(BYTE *)iEnd,(BYTE *)puVar44,iStart);
              if (seqStore->maxNbSeq <= (ulong)((long)psVar42 - (long)seqStore->sequencesStart >> 3)
                 ) goto LAB_00140c69;
              if (0x20000 < seqStore->maxNbLit) goto LAB_00140cc6;
              puVar44 = (ulong *)seqStore->lit;
              if (seqStore->litStart + seqStore->maxNbLit < puVar44) goto LAB_00140c88;
              if (iEnd < puVar27) goto LAB_00140ca7;
              if (puVar1 < puVar27) {
                ZSTD_safecopyLiterals
                          ((BYTE *)puVar44,(BYTE *)puVar27,(BYTE *)puVar27,(BYTE *)puVar1);
              }
              else {
                uVar46 = puVar27[1];
                *puVar44 = *puVar27;
                puVar44[1] = uVar46;
              }
              psVar42 = seqStore->sequences;
              psVar42->litLength = 0;
              psVar42->offset = 1;
              if (0xffff < sVar16 + 1) {
                if (seqStore->longLengthID != 0) goto LAB_00140ce5;
                seqStore->longLengthID = 2;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar42 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar42->matchLength = (U16)(sVar16 + 1);
              psVar42 = psVar42 + 1;
              seqStore->sequences = psVar42;
              pUVar8[*puVar27 * -0x30e4432345000000 >> (bVar18 & 0x3f)] = UVar43;
              puVar27 = (ulong *)((long)puVar27 + sVar16 + 4);
              puVar44 = puVar27;
              uVar39 = uVar40;
              uVar40 = uVar30;
            } while (puVar27 <= puVar21);
          }
        }
      } while (puVar44 < puVar21);
    }
  }
  else if (uVar20 == 6) {
    if (uVar37 < uVar38) goto LAB_00140d9f;
    if (uVar4 < uVar35) goto LAB_00140dbe;
    if (uVar30 < uVar39) goto LAB_00140ddd;
    puVar44 = (ulong *)((long)src + (ulong)(iVar29 == iVar19));
    if (uVar30 < uVar40) goto LAB_00140dfc;
    if (puVar44 < puVar21) {
      bVar18 = 0x40 - cVar13;
      puVar1 = iEnd + -4;
      do {
        uVar46 = *puVar44;
        uVar36 = uVar46 * -0x30e4432340650000 >> (bVar18 & 0x3f);
        uVar25 = (long)puVar44 - (long)pBVar9;
        UVar43 = (U32)uVar25;
        uVar20 = (UVar43 - uVar39) + 1;
        piVar33 = (int *)(pBVar9 + uVar20);
        if (uVar20 < uVar4) {
          piVar33 = (int *)(pBVar10 + (uVar20 - uVar28));
        }
        uVar30 = pUVar8[uVar36];
        uVar34 = (ulong)uVar30;
        pUVar8[uVar36] = UVar43;
        if (((uVar4 - 1) - uVar20 < 3) || (*piVar33 != *(int *)((long)puVar44 + 1))) {
          puVar45 = puVar44;
          if (uVar30 <= uVar4) {
            uVar20 = pUVar11[uVar46 * -0x30e4432340650000 >> (0x40U - cVar14 & 0x3f)];
            if ((uVar20 <= uVar5) || (*(int *)(pBVar10 + uVar20) != (int)*puVar44)) {
              puVar44 = (ulong *)((long)puVar44 +
                                 ((long)puVar44 - (long)puVar27 >> 8) + (ulong)uVar15);
              goto LAB_0013f712;
            }
            sVar16 = ZSTD_count_2segments
                               ((BYTE *)((long)puVar44 + 4),(BYTE *)((long)(pBVar10 + uVar20) + 4),
                                (BYTE *)iEnd,(BYTE *)mEnd,iStart);
            lVar31 = sVar16 + 4;
            if (puVar27 < puVar44) {
              pBVar17 = pBVar10 + ((ulong)uVar20 - 1);
              do {
                puVar23 = (ulong *)((long)puVar44 + -1);
                puVar45 = puVar44;
                if ((*(BYTE *)puVar23 != *pBVar17) ||
                   (lVar31 = lVar31 + 1, puVar45 = puVar23, pBVar17 <= pBVar22)) break;
                pBVar17 = pBVar17 + -1;
                puVar44 = puVar23;
              } while (puVar27 < puVar23);
            }
            if ((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3) <
                seqStore->maxNbSeq) {
              if (seqStore->maxNbLit < 0x20001) {
                uVar46 = (long)puVar45 - (long)puVar27;
                puVar44 = (ulong *)seqStore->lit;
                if ((BYTE *)((long)puVar44 + uVar46) <= seqStore->litStart + seqStore->maxNbLit) {
                  if (puVar45 <= iEnd) {
                    if (puVar1 < puVar45) {
                      ZSTD_safecopyLiterals
                                ((BYTE *)puVar44,(BYTE *)puVar27,(BYTE *)puVar45,(BYTE *)puVar1);
LAB_0013f3f7:
                      seqStore->lit = seqStore->lit + uVar46;
                      if (0xffff < uVar46) {
                        if (seqStore->longLengthID != 0) goto LAB_00140d23;
                        seqStore->longLengthID = 1;
                        seqStore->longLengthPos =
                             (U32)((ulong)((long)seqStore->sequences -
                                          (long)seqStore->sequencesStart) >> 3);
                      }
                    }
                    else {
                      uVar36 = puVar27[1];
                      *puVar44 = *puVar27;
                      puVar44[1] = uVar36;
                      pBVar17 = seqStore->lit;
                      if (0x10 < uVar46) {
                        lVar32 = (long)(pBVar17 + 0x10) - (long)(puVar27 + 2);
                        if (lVar32 < 8) {
                          if (-0x10 < lVar32) goto LAB_00140d42;
                        }
                        else if (0xffffffffffffffe0 < lVar32 - 0x10U) goto LAB_00140d61;
                        uVar36 = puVar27[3];
                        *(ulong *)(pBVar17 + 0x10) = puVar27[2];
                        *(ulong *)(pBVar17 + 0x18) = uVar36;
                        if (0x20 < (long)uVar46) {
                          lVar32 = 0;
                          do {
                            puVar3 = (undefined8 *)((long)puVar27 + lVar32 + 0x20);
                            uVar12 = puVar3[1];
                            pBVar2 = pBVar17 + lVar32 + 0x20;
                            *(undefined8 *)pBVar2 = *puVar3;
                            *(undefined8 *)(pBVar2 + 8) = uVar12;
                            puVar3 = (undefined8 *)((long)puVar27 + lVar32 + 0x30);
                            uVar12 = puVar3[1];
                            *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
                            *(undefined8 *)(pBVar2 + 0x18) = uVar12;
                            lVar32 = lVar32 + 0x20;
                          } while (pBVar2 + 0x20 < pBVar17 + uVar46);
                        }
                        goto LAB_0013f3f7;
                      }
                      seqStore->lit = pBVar17 + uVar46;
                    }
                    uVar20 = UVar43 - (uVar20 + uVar28);
                    uVar36 = lVar31 - 3;
                    psVar42 = seqStore->sequences;
                    psVar42->litLength = (U16)uVar46;
                    psVar42->offset = uVar20 + 3;
                    uVar40 = uVar39;
                    if (uVar36 < 0x10000) goto LAB_0013f535;
                    UVar6 = seqStore->longLengthID;
joined_r0x0013f513:
                    uVar40 = uVar39;
                    if (UVar6 == 0) goto LAB_0013f519;
                    goto LAB_00140ce5;
                  }
                  goto LAB_00140ca7;
                }
                goto LAB_00140c88;
              }
              goto LAB_00140cc6;
            }
            goto LAB_00140c69;
          }
          piVar33 = (int *)(pBVar9 + uVar34);
          if (*piVar33 == (int)*puVar44) {
            puVar23 = (ulong *)((long)puVar44 + 4);
            puVar24 = (ulong *)(piVar33 + 1);
            puVar26 = puVar23;
            if (puVar23 < (ulong *)((long)iEnd - 7U)) {
              if (*puVar24 == *puVar23) {
                lVar31 = 0;
                do {
                  puVar24 = (ulong *)((long)puVar44 + lVar31 + 0xc);
                  if ((ulong *)((long)iEnd - 7U) <= puVar24) {
                    puVar24 = (ulong *)(pBVar9 + lVar31 + uVar34 + 0xc);
                    puVar26 = (ulong *)((long)puVar44 + lVar31 + 0xc);
                    goto LAB_0013f1cb;
                  }
                  lVar32 = lVar31 + uVar34 + 0xc;
                  uVar46 = *puVar24;
                  lVar31 = lVar31 + 8;
                } while (*(ulong *)(pBVar9 + lVar32) == uVar46);
                uVar46 = uVar46 ^ *(ulong *)(pBVar9 + lVar32);
                uVar36 = 0;
                if (uVar46 != 0) {
                  for (; (uVar46 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
                  }
                }
                uVar46 = (uVar36 >> 3 & 0x1fffffff) + lVar31;
              }
              else {
                uVar36 = *puVar23 ^ *puVar24;
                uVar46 = 0;
                if (uVar36 != 0) {
                  for (; (uVar36 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
                  }
                }
                uVar46 = uVar46 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_0013f1cb:
              if ((puVar26 < (ulong *)((long)iEnd - 3U)) && ((int)*puVar24 == (int)*puVar26)) {
                puVar26 = (ulong *)((long)puVar26 + 4);
                puVar24 = (ulong *)((long)puVar24 + 4);
              }
              if ((puVar26 < (ulong *)((long)iEnd + -1)) && ((short)*puVar24 == (short)*puVar26)) {
                puVar26 = (ulong *)((long)puVar26 + 2);
                puVar24 = (ulong *)((long)puVar24 + 2);
              }
              if (puVar26 < iEnd) {
                puVar26 = (ulong *)((long)puVar26 + (ulong)((BYTE)*puVar24 == (BYTE)*puVar26));
              }
              uVar46 = (long)puVar26 - (long)puVar23;
            }
            lVar31 = uVar46 + 4;
            if (puVar27 < puVar44) {
              pBVar17 = pBVar9 + (uVar34 - 1);
              do {
                puVar23 = (ulong *)((long)puVar45 + -1);
                if ((*(BYTE *)puVar23 != *pBVar17) ||
                   (lVar31 = lVar31 + 1, puVar45 = puVar23, pBVar17 <= iStart)) break;
                pBVar17 = pBVar17 + -1;
              } while (puVar27 < puVar23);
            }
            if ((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3) <
                seqStore->maxNbSeq) {
              if (seqStore->maxNbLit < 0x20001) {
                uVar46 = (long)puVar45 - (long)puVar27;
                puVar23 = (ulong *)seqStore->lit;
                if ((BYTE *)((long)puVar23 + uVar46) <= seqStore->litStart + seqStore->maxNbLit) {
                  if (puVar45 <= iEnd) {
                    if (puVar1 < puVar45) {
                      ZSTD_safecopyLiterals
                                ((BYTE *)puVar23,(BYTE *)puVar27,(BYTE *)puVar45,(BYTE *)puVar1);
LAB_0013f2c6:
                      seqStore->lit = seqStore->lit + uVar46;
                      if (0xffff < uVar46) {
                        if (seqStore->longLengthID != 0) goto LAB_00140d23;
                        seqStore->longLengthID = 1;
                        seqStore->longLengthPos =
                             (U32)((ulong)((long)seqStore->sequences -
                                          (long)seqStore->sequencesStart) >> 3);
                      }
                    }
                    else {
                      uVar36 = puVar27[1];
                      *puVar23 = *puVar27;
                      puVar23[1] = uVar36;
                      pBVar17 = seqStore->lit;
                      if (0x10 < uVar46) {
                        lVar32 = (long)(pBVar17 + 0x10) - (long)(puVar27 + 2);
                        if (lVar32 < 8) {
                          if (-0x10 < lVar32) goto LAB_00140d42;
                        }
                        else if (0xffffffffffffffe0 < lVar32 - 0x10U) goto LAB_00140d61;
                        uVar36 = puVar27[3];
                        *(ulong *)(pBVar17 + 0x10) = puVar27[2];
                        *(ulong *)(pBVar17 + 0x18) = uVar36;
                        if (0x20 < (long)uVar46) {
                          lVar32 = 0;
                          do {
                            puVar3 = (undefined8 *)((long)puVar27 + lVar32 + 0x20);
                            uVar12 = puVar3[1];
                            pBVar2 = pBVar17 + lVar32 + 0x20;
                            *(undefined8 *)pBVar2 = *puVar3;
                            *(undefined8 *)(pBVar2 + 8) = uVar12;
                            puVar3 = (undefined8 *)((long)puVar27 + lVar32 + 0x30);
                            uVar12 = puVar3[1];
                            *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
                            *(undefined8 *)(pBVar2 + 0x18) = uVar12;
                            lVar32 = lVar32 + 0x20;
                          } while (pBVar2 + 0x20 < pBVar17 + uVar46);
                        }
                        goto LAB_0013f2c6;
                      }
                      seqStore->lit = pBVar17 + uVar46;
                    }
                    uVar20 = (int)puVar44 - (int)piVar33;
                    uVar36 = lVar31 - 3;
                    psVar42 = seqStore->sequences;
                    psVar42->litLength = (U16)uVar46;
                    psVar42->offset = uVar20 + 3;
                    uVar40 = uVar39;
                    if (0xffff < uVar36) {
                      UVar6 = seqStore->longLengthID;
                      goto joined_r0x0013f513;
                    }
                    goto LAB_0013f535;
                  }
                  goto LAB_00140ca7;
                }
                goto LAB_00140c88;
              }
              goto LAB_00140cc6;
            }
            goto LAB_00140c69;
          }
          puVar44 = (ulong *)((long)puVar44 + ((long)puVar44 - (long)puVar27 >> 8) + (ulong)uVar15);
        }
        else {
          puVar45 = iEnd;
          if (uVar20 < uVar4) {
            puVar45 = mEnd;
          }
          sVar16 = ZSTD_count_2segments
                             ((BYTE *)((long)puVar44 + 5),(BYTE *)(piVar33 + 1),(BYTE *)iEnd,
                              (BYTE *)puVar45,iStart);
          if (seqStore->maxNbSeq <=
              (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
          goto LAB_00140c69;
          if (0x20000 < seqStore->maxNbLit) goto LAB_00140cc6;
          puVar45 = (ulong *)((long)puVar44 + 1);
          uVar46 = (long)puVar45 - (long)puVar27;
          puVar44 = (ulong *)seqStore->lit;
          if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar44 + uVar46))
          goto LAB_00140c88;
          if (iEnd < puVar45) goto LAB_00140ca7;
          if (puVar1 < puVar45) {
            ZSTD_safecopyLiterals((BYTE *)puVar44,(BYTE *)puVar27,(BYTE *)puVar45,(BYTE *)puVar1);
LAB_0013eef0:
            seqStore->lit = seqStore->lit + uVar46;
            if (0xffff < uVar46) {
              if (seqStore->longLengthID != 0) goto LAB_00140d23;
              seqStore->longLengthID = 1;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
            }
          }
          else {
            uVar36 = puVar27[1];
            *puVar44 = *puVar27;
            puVar44[1] = uVar36;
            pBVar17 = seqStore->lit;
            if (0x10 < uVar46) {
              lVar31 = (long)(pBVar17 + 0x10) - (long)(puVar27 + 2);
              if (lVar31 < 8) {
                if (-0x10 < lVar31) goto LAB_00140d42;
              }
              else if (0xffffffffffffffe0 < lVar31 - 0x10U) goto LAB_00140d61;
              uVar36 = puVar27[3];
              *(ulong *)(pBVar17 + 0x10) = puVar27[2];
              *(ulong *)(pBVar17 + 0x18) = uVar36;
              if (0x20 < (long)uVar46) {
                lVar31 = 0;
                do {
                  puVar3 = (undefined8 *)((long)puVar27 + lVar31 + 0x20);
                  uVar12 = puVar3[1];
                  pBVar2 = pBVar17 + lVar31 + 0x20;
                  *(undefined8 *)pBVar2 = *puVar3;
                  *(undefined8 *)(pBVar2 + 8) = uVar12;
                  puVar3 = (undefined8 *)((long)puVar27 + lVar31 + 0x30);
                  uVar12 = puVar3[1];
                  *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
                  *(undefined8 *)(pBVar2 + 0x18) = uVar12;
                  lVar31 = lVar31 + 0x20;
                } while (pBVar2 + 0x20 < pBVar17 + uVar46);
              }
              goto LAB_0013eef0;
            }
            seqStore->lit = pBVar17 + uVar46;
          }
          lVar31 = sVar16 + 4;
          uVar36 = sVar16 + 1;
          psVar42 = seqStore->sequences;
          psVar42->litLength = (U16)uVar46;
          psVar42->offset = 1;
          uVar20 = uVar39;
          if (0xffff < uVar36) {
            if (seqStore->longLengthID != 0) goto LAB_00140ce5;
LAB_0013f519:
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar42 - (long)seqStore->sequencesStart) >> 3);
          }
LAB_0013f535:
          uVar39 = uVar20;
          puVar27 = (ulong *)(lVar31 + (long)puVar45);
          psVar42->matchLength = (U16)uVar36;
          psVar42 = psVar42 + 1;
          seqStore->sequences = psVar42;
          puVar44 = puVar27;
          if (puVar27 <= puVar21) {
            if (pBVar9 + (uVar25 & 0xffffffff) + 2 <= src) goto LAB_00140d04;
            pUVar8[(ulong)(*(long *)(pBVar9 + (uVar25 & 0xffffffff) + 2) * -0x30e4432340650000) >>
                   (bVar18 & 0x3f)] = UVar43 + 2;
            pUVar8[(ulong)(*(long *)((long)puVar27 + -2) * -0x30e4432340650000) >> (bVar18 & 0x3f)]
                 = ((int)puVar27 + -2) - iVar41;
            do {
              uVar30 = uVar39;
              UVar43 = (int)puVar27 - iVar41;
              uVar20 = UVar43 - uVar40;
              pBVar17 = pBVar9;
              if (uVar20 < uVar4) {
                pBVar17 = pBVar10 + -(ulong)uVar28;
              }
              puVar44 = puVar27;
              uVar39 = uVar30;
              if (((uVar4 - 1) - uVar20 < 3) || (*(int *)(pBVar17 + uVar20) != (int)*puVar27))
              break;
              puVar44 = iEnd;
              if (uVar20 < uVar4) {
                puVar44 = mEnd;
              }
              sVar16 = ZSTD_count_2segments
                                 ((BYTE *)((long)puVar27 + 4),(BYTE *)((long)(pBVar17 + uVar20) + 4)
                                  ,(BYTE *)iEnd,(BYTE *)puVar44,iStart);
              if (seqStore->maxNbSeq <= (ulong)((long)psVar42 - (long)seqStore->sequencesStart >> 3)
                 ) goto LAB_00140c69;
              if (0x20000 < seqStore->maxNbLit) goto LAB_00140cc6;
              puVar44 = (ulong *)seqStore->lit;
              if (seqStore->litStart + seqStore->maxNbLit < puVar44) goto LAB_00140c88;
              if (iEnd < puVar27) goto LAB_00140ca7;
              if (puVar1 < puVar27) {
                ZSTD_safecopyLiterals
                          ((BYTE *)puVar44,(BYTE *)puVar27,(BYTE *)puVar27,(BYTE *)puVar1);
              }
              else {
                uVar46 = puVar27[1];
                *puVar44 = *puVar27;
                puVar44[1] = uVar46;
              }
              psVar42 = seqStore->sequences;
              psVar42->litLength = 0;
              psVar42->offset = 1;
              if (0xffff < sVar16 + 1) {
                if (seqStore->longLengthID != 0) goto LAB_00140ce5;
                seqStore->longLengthID = 2;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar42 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar42->matchLength = (U16)(sVar16 + 1);
              psVar42 = psVar42 + 1;
              seqStore->sequences = psVar42;
              pUVar8[*puVar27 * -0x30e4432340650000 >> (bVar18 & 0x3f)] = UVar43;
              puVar27 = (ulong *)((long)puVar27 + sVar16 + 4);
              puVar44 = puVar27;
              uVar39 = uVar40;
              uVar40 = uVar30;
            } while (puVar27 <= puVar21);
          }
        }
LAB_0013f712:
      } while (puVar44 < puVar21);
    }
  }
  else if (uVar20 == 7) {
    if (uVar37 < uVar38) {
LAB_00140d9f:
      __assert_fail("endIndex - prefixStartIndex <= maxDistance",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x3dd8,
                    "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                   );
    }
    if (uVar4 < uVar35) {
LAB_00140dbe:
      __assert_fail("prefixStartIndex >= (U32)(dictEnd - dictBase)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x3ddd,
                    "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                   );
    }
    if (uVar30 < uVar39) {
LAB_00140ddd:
      __assert_fail("offset_1 <= dictAndPrefixLength",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x3de4,
                    "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                   );
    }
    puVar44 = (ulong *)((long)src + (ulong)(iVar29 == iVar19));
    if (uVar30 < uVar40) {
LAB_00140dfc:
      __assert_fail("offset_2 <= dictAndPrefixLength",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x3de5,
                    "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                   );
    }
    if (puVar44 < puVar21) {
      bVar18 = 0x40 - cVar13;
      puVar1 = iEnd + -4;
      do {
        uVar46 = *puVar44;
        uVar36 = uVar46 * -0x30e44323405a9d00 >> (bVar18 & 0x3f);
        uVar25 = (long)puVar44 - (long)pBVar9;
        UVar43 = (U32)uVar25;
        uVar20 = (UVar43 - uVar39) + 1;
        piVar33 = (int *)(pBVar9 + uVar20);
        if (uVar20 < uVar4) {
          piVar33 = (int *)(pBVar10 + (uVar20 - uVar28));
        }
        uVar30 = pUVar8[uVar36];
        uVar34 = (ulong)uVar30;
        pUVar8[uVar36] = UVar43;
        if (((uVar4 - 1) - uVar20 < 3) || (*piVar33 != *(int *)((long)puVar44 + 1))) {
          puVar45 = puVar44;
          if (uVar30 <= uVar4) {
            uVar20 = pUVar11[uVar46 * -0x30e44323405a9d00 >> (0x40U - cVar14 & 0x3f)];
            if ((uVar20 <= uVar5) || (*(int *)(pBVar10 + uVar20) != (int)*puVar44)) {
              puVar44 = (ulong *)((long)puVar44 +
                                 ((long)puVar44 - (long)puVar27 >> 8) + (ulong)uVar15);
              goto LAB_0013ec55;
            }
            sVar16 = ZSTD_count_2segments
                               ((BYTE *)((long)puVar44 + 4),(BYTE *)((long)(pBVar10 + uVar20) + 4),
                                (BYTE *)iEnd,(BYTE *)mEnd,iStart);
            lVar31 = sVar16 + 4;
            if (puVar27 < puVar44) {
              pBVar17 = pBVar10 + ((ulong)uVar20 - 1);
              do {
                puVar23 = (ulong *)((long)puVar44 + -1);
                puVar45 = puVar44;
                if ((*(BYTE *)puVar23 != *pBVar17) ||
                   (lVar31 = lVar31 + 1, puVar45 = puVar23, pBVar17 <= pBVar22)) break;
                pBVar17 = pBVar17 + -1;
                puVar44 = puVar23;
              } while (puVar27 < puVar23);
            }
            if ((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3) <
                seqStore->maxNbSeq) {
              if (seqStore->maxNbLit < 0x20001) {
                uVar46 = (long)puVar45 - (long)puVar27;
                puVar44 = (ulong *)seqStore->lit;
                if ((BYTE *)((long)puVar44 + uVar46) <= seqStore->litStart + seqStore->maxNbLit) {
                  if (puVar45 <= iEnd) {
                    if (puVar1 < puVar45) {
                      ZSTD_safecopyLiterals
                                ((BYTE *)puVar44,(BYTE *)puVar27,(BYTE *)puVar45,(BYTE *)puVar1);
LAB_0013e93a:
                      seqStore->lit = seqStore->lit + uVar46;
                      if (0xffff < uVar46) {
                        if (seqStore->longLengthID != 0) goto LAB_00140d23;
                        seqStore->longLengthID = 1;
                        seqStore->longLengthPos =
                             (U32)((ulong)((long)seqStore->sequences -
                                          (long)seqStore->sequencesStart) >> 3);
                      }
                    }
                    else {
                      uVar36 = puVar27[1];
                      *puVar44 = *puVar27;
                      puVar44[1] = uVar36;
                      pBVar17 = seqStore->lit;
                      if (0x10 < uVar46) {
                        lVar32 = (long)(pBVar17 + 0x10) - (long)(puVar27 + 2);
                        if (lVar32 < 8) {
                          if (-0x10 < lVar32) goto LAB_00140d42;
                        }
                        else if (0xffffffffffffffe0 < lVar32 - 0x10U) goto LAB_00140d61;
                        uVar36 = puVar27[3];
                        *(ulong *)(pBVar17 + 0x10) = puVar27[2];
                        *(ulong *)(pBVar17 + 0x18) = uVar36;
                        if (0x20 < (long)uVar46) {
                          lVar32 = 0;
                          do {
                            puVar3 = (undefined8 *)((long)puVar27 + lVar32 + 0x20);
                            uVar12 = puVar3[1];
                            pBVar2 = pBVar17 + lVar32 + 0x20;
                            *(undefined8 *)pBVar2 = *puVar3;
                            *(undefined8 *)(pBVar2 + 8) = uVar12;
                            puVar3 = (undefined8 *)((long)puVar27 + lVar32 + 0x30);
                            uVar12 = puVar3[1];
                            *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
                            *(undefined8 *)(pBVar2 + 0x18) = uVar12;
                            lVar32 = lVar32 + 0x20;
                          } while (pBVar2 + 0x20 < pBVar17 + uVar46);
                        }
                        goto LAB_0013e93a;
                      }
                      seqStore->lit = pBVar17 + uVar46;
                    }
                    uVar20 = UVar43 - (uVar20 + uVar28);
                    uVar36 = lVar31 - 3;
                    psVar42 = seqStore->sequences;
                    psVar42->litLength = (U16)uVar46;
                    psVar42->offset = uVar20 + 3;
                    uVar40 = uVar39;
                    if (uVar36 < 0x10000) goto LAB_0013ea78;
                    UVar6 = seqStore->longLengthID;
joined_r0x0013ea56:
                    uVar40 = uVar39;
                    if (UVar6 == 0) goto LAB_0013ea5c;
LAB_00140ce5:
                    __assert_fail("seqStorePtr->longLengthID == 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                  ,0x2058,
                                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                                 );
                  }
                  goto LAB_00140ca7;
                }
                goto LAB_00140c88;
              }
              goto LAB_00140cc6;
            }
            goto LAB_00140c69;
          }
          piVar33 = (int *)(pBVar9 + uVar34);
          if (*piVar33 == (int)*puVar44) {
            puVar23 = (ulong *)((long)puVar44 + 4);
            puVar24 = (ulong *)(piVar33 + 1);
            puVar26 = puVar23;
            if (puVar23 < (ulong *)((long)iEnd - 7U)) {
              if (*puVar24 == *puVar23) {
                lVar31 = 0;
                do {
                  puVar24 = (ulong *)((long)puVar44 + lVar31 + 0xc);
                  if ((ulong *)((long)iEnd - 7U) <= puVar24) {
                    puVar24 = (ulong *)(pBVar9 + lVar31 + uVar34 + 0xc);
                    puVar26 = (ulong *)((long)puVar44 + lVar31 + 0xc);
                    goto LAB_0013e70e;
                  }
                  lVar32 = lVar31 + uVar34 + 0xc;
                  uVar46 = *puVar24;
                  lVar31 = lVar31 + 8;
                } while (*(ulong *)(pBVar9 + lVar32) == uVar46);
                uVar46 = uVar46 ^ *(ulong *)(pBVar9 + lVar32);
                uVar36 = 0;
                if (uVar46 != 0) {
                  for (; (uVar46 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
                  }
                }
                uVar46 = (uVar36 >> 3 & 0x1fffffff) + lVar31;
              }
              else {
                uVar36 = *puVar23 ^ *puVar24;
                uVar46 = 0;
                if (uVar36 != 0) {
                  for (; (uVar36 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
                  }
                }
                uVar46 = uVar46 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_0013e70e:
              if ((puVar26 < (ulong *)((long)iEnd - 3U)) && ((int)*puVar24 == (int)*puVar26)) {
                puVar26 = (ulong *)((long)puVar26 + 4);
                puVar24 = (ulong *)((long)puVar24 + 4);
              }
              if ((puVar26 < (ulong *)((long)iEnd + -1)) && ((short)*puVar24 == (short)*puVar26)) {
                puVar26 = (ulong *)((long)puVar26 + 2);
                puVar24 = (ulong *)((long)puVar24 + 2);
              }
              if (puVar26 < iEnd) {
                puVar26 = (ulong *)((long)puVar26 + (ulong)((BYTE)*puVar24 == (BYTE)*puVar26));
              }
              uVar46 = (long)puVar26 - (long)puVar23;
            }
            lVar31 = uVar46 + 4;
            if (puVar27 < puVar44) {
              pBVar17 = pBVar9 + (uVar34 - 1);
              do {
                puVar23 = (ulong *)((long)puVar45 + -1);
                if ((*(BYTE *)puVar23 != *pBVar17) ||
                   (lVar31 = lVar31 + 1, puVar45 = puVar23, pBVar17 <= iStart)) break;
                pBVar17 = pBVar17 + -1;
              } while (puVar27 < puVar23);
            }
            if ((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3) <
                seqStore->maxNbSeq) {
              if (seqStore->maxNbLit < 0x20001) {
                uVar46 = (long)puVar45 - (long)puVar27;
                puVar23 = (ulong *)seqStore->lit;
                if ((BYTE *)((long)puVar23 + uVar46) <= seqStore->litStart + seqStore->maxNbLit) {
                  if (puVar45 <= iEnd) {
                    if (puVar1 < puVar45) {
                      ZSTD_safecopyLiterals
                                ((BYTE *)puVar23,(BYTE *)puVar27,(BYTE *)puVar45,(BYTE *)puVar1);
LAB_0013e809:
                      seqStore->lit = seqStore->lit + uVar46;
                      if (0xffff < uVar46) {
                        if (seqStore->longLengthID != 0) goto LAB_00140d23;
                        seqStore->longLengthID = 1;
                        seqStore->longLengthPos =
                             (U32)((ulong)((long)seqStore->sequences -
                                          (long)seqStore->sequencesStart) >> 3);
                      }
                    }
                    else {
                      uVar36 = puVar27[1];
                      *puVar23 = *puVar27;
                      puVar23[1] = uVar36;
                      pBVar17 = seqStore->lit;
                      if (0x10 < uVar46) {
                        lVar32 = (long)(pBVar17 + 0x10) - (long)(puVar27 + 2);
                        if (lVar32 < 8) {
                          if (-0x10 < lVar32) goto LAB_00140d42;
                        }
                        else if (0xffffffffffffffe0 < lVar32 - 0x10U) goto LAB_00140d61;
                        uVar36 = puVar27[3];
                        *(ulong *)(pBVar17 + 0x10) = puVar27[2];
                        *(ulong *)(pBVar17 + 0x18) = uVar36;
                        if (0x20 < (long)uVar46) {
                          lVar32 = 0;
                          do {
                            puVar3 = (undefined8 *)((long)puVar27 + lVar32 + 0x20);
                            uVar12 = puVar3[1];
                            pBVar2 = pBVar17 + lVar32 + 0x20;
                            *(undefined8 *)pBVar2 = *puVar3;
                            *(undefined8 *)(pBVar2 + 8) = uVar12;
                            puVar3 = (undefined8 *)((long)puVar27 + lVar32 + 0x30);
                            uVar12 = puVar3[1];
                            *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
                            *(undefined8 *)(pBVar2 + 0x18) = uVar12;
                            lVar32 = lVar32 + 0x20;
                          } while (pBVar2 + 0x20 < pBVar17 + uVar46);
                        }
                        goto LAB_0013e809;
                      }
                      seqStore->lit = pBVar17 + uVar46;
                    }
                    uVar20 = (int)puVar44 - (int)piVar33;
                    uVar36 = lVar31 - 3;
                    psVar42 = seqStore->sequences;
                    psVar42->litLength = (U16)uVar46;
                    psVar42->offset = uVar20 + 3;
                    uVar40 = uVar39;
                    if (0xffff < uVar36) {
                      UVar6 = seqStore->longLengthID;
                      goto joined_r0x0013ea56;
                    }
                    goto LAB_0013ea78;
                  }
                  goto LAB_00140ca7;
                }
                goto LAB_00140c88;
              }
              goto LAB_00140cc6;
            }
            goto LAB_00140c69;
          }
          puVar44 = (ulong *)((long)puVar44 + ((long)puVar44 - (long)puVar27 >> 8) + (ulong)uVar15);
        }
        else {
          puVar45 = iEnd;
          if (uVar20 < uVar4) {
            puVar45 = mEnd;
          }
          sVar16 = ZSTD_count_2segments
                             ((BYTE *)((long)puVar44 + 5),(BYTE *)(piVar33 + 1),(BYTE *)iEnd,
                              (BYTE *)puVar45,iStart);
          if (seqStore->maxNbSeq <=
              (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
LAB_00140c69:
            __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x2038,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (0x20000 < seqStore->maxNbLit) {
LAB_00140cc6:
            __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x203a,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          puVar45 = (ulong *)((long)puVar44 + 1);
          uVar46 = (long)puVar45 - (long)puVar27;
          puVar44 = (ulong *)seqStore->lit;
          if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar44 + uVar46)) {
LAB_00140c88:
            __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x203b,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (iEnd < puVar45) {
LAB_00140ca7:
            __assert_fail("literals + litLength <= litLimit",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x203c,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (puVar1 < puVar45) {
            ZSTD_safecopyLiterals((BYTE *)puVar44,(BYTE *)puVar27,(BYTE *)puVar45,(BYTE *)puVar1);
LAB_0013e433:
            seqStore->lit = seqStore->lit + uVar46;
            if (0xffff < uVar46) {
              if (seqStore->longLengthID != 0) {
LAB_00140d23:
                __assert_fail("seqStorePtr->longLengthID == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x204d,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              seqStore->longLengthID = 1;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
            }
          }
          else {
            uVar36 = puVar27[1];
            *puVar44 = *puVar27;
            puVar44[1] = uVar36;
            pBVar17 = seqStore->lit;
            if (0x10 < uVar46) {
              lVar31 = (long)(pBVar17 + 0x10) - (long)(puVar27 + 2);
              if (lVar31 < 8) {
                if (-0x10 < lVar31) {
LAB_00140d42:
                  __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                ,0x1268,
                                "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                               );
                }
              }
              else if (0xffffffffffffffe0 < lVar31 - 0x10U) {
LAB_00140d61:
                __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x1270,
                              "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                             );
              }
              uVar36 = puVar27[3];
              *(ulong *)(pBVar17 + 0x10) = puVar27[2];
              *(ulong *)(pBVar17 + 0x18) = uVar36;
              if (0x20 < (long)uVar46) {
                lVar31 = 0;
                do {
                  puVar3 = (undefined8 *)((long)puVar27 + lVar31 + 0x20);
                  uVar12 = puVar3[1];
                  pBVar2 = pBVar17 + lVar31 + 0x20;
                  *(undefined8 *)pBVar2 = *puVar3;
                  *(undefined8 *)(pBVar2 + 8) = uVar12;
                  puVar3 = (undefined8 *)((long)puVar27 + lVar31 + 0x30);
                  uVar12 = puVar3[1];
                  *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
                  *(undefined8 *)(pBVar2 + 0x18) = uVar12;
                  lVar31 = lVar31 + 0x20;
                } while (pBVar2 + 0x20 < pBVar17 + uVar46);
              }
              goto LAB_0013e433;
            }
            seqStore->lit = pBVar17 + uVar46;
          }
          lVar31 = sVar16 + 4;
          uVar36 = sVar16 + 1;
          psVar42 = seqStore->sequences;
          psVar42->litLength = (U16)uVar46;
          psVar42->offset = 1;
          uVar20 = uVar39;
          if (0xffff < uVar36) {
            if (seqStore->longLengthID != 0) goto LAB_00140ce5;
LAB_0013ea5c:
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar42 - (long)seqStore->sequencesStart) >> 3);
          }
LAB_0013ea78:
          uVar39 = uVar20;
          puVar27 = (ulong *)(lVar31 + (long)puVar45);
          psVar42->matchLength = (U16)uVar36;
          psVar42 = psVar42 + 1;
          seqStore->sequences = psVar42;
          puVar44 = puVar27;
          if (puVar27 <= puVar21) {
            if (pBVar9 + (uVar25 & 0xffffffff) + 2 <= src) {
LAB_00140d04:
              __assert_fail("base+current+2 > istart",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x3e25,
                            "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                           );
            }
            pUVar8[(ulong)(*(long *)(pBVar9 + (uVar25 & 0xffffffff) + 2) * -0x30e44323405a9d00) >>
                   (bVar18 & 0x3f)] = UVar43 + 2;
            pUVar8[(ulong)(*(long *)((long)puVar27 + -2) * -0x30e44323405a9d00) >> (bVar18 & 0x3f)]
                 = ((int)puVar27 + -2) - iVar41;
            do {
              uVar30 = uVar39;
              UVar43 = (int)puVar27 - iVar41;
              uVar20 = UVar43 - uVar40;
              pBVar17 = pBVar9;
              if (uVar20 < uVar4) {
                pBVar17 = pBVar10 + -(ulong)uVar28;
              }
              puVar44 = puVar27;
              uVar39 = uVar30;
              if (((uVar4 - 1) - uVar20 < 3) || (*(int *)(pBVar17 + uVar20) != (int)*puVar27))
              break;
              puVar44 = iEnd;
              if (uVar20 < uVar4) {
                puVar44 = mEnd;
              }
              sVar16 = ZSTD_count_2segments
                                 ((BYTE *)((long)puVar27 + 4),(BYTE *)((long)(pBVar17 + uVar20) + 4)
                                  ,(BYTE *)iEnd,(BYTE *)puVar44,iStart);
              if (seqStore->maxNbSeq <= (ulong)((long)psVar42 - (long)seqStore->sequencesStart >> 3)
                 ) goto LAB_00140c69;
              if (0x20000 < seqStore->maxNbLit) goto LAB_00140cc6;
              puVar44 = (ulong *)seqStore->lit;
              if (seqStore->litStart + seqStore->maxNbLit < puVar44) goto LAB_00140c88;
              if (iEnd < puVar27) goto LAB_00140ca7;
              if (puVar1 < puVar27) {
                ZSTD_safecopyLiterals
                          ((BYTE *)puVar44,(BYTE *)puVar27,(BYTE *)puVar27,(BYTE *)puVar1);
              }
              else {
                uVar46 = puVar27[1];
                *puVar44 = *puVar27;
                puVar44[1] = uVar46;
              }
              psVar42 = seqStore->sequences;
              psVar42->litLength = 0;
              psVar42->offset = 1;
              if (0xffff < sVar16 + 1) {
                if (seqStore->longLengthID != 0) goto LAB_00140ce5;
                seqStore->longLengthID = 2;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar42 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar42->matchLength = (U16)(sVar16 + 1);
              psVar42 = psVar42 + 1;
              seqStore->sequences = psVar42;
              pUVar8[*puVar27 * -0x30e44323405a9d00 >> (bVar18 & 0x3f)] = UVar43;
              puVar27 = (ulong *)((long)puVar27 + sVar16 + 4);
              puVar44 = puVar27;
              uVar39 = uVar40;
              uVar40 = uVar30;
            } while (puVar27 <= puVar21);
          }
        }
LAB_0013ec55:
      } while (puVar44 < puVar21);
    }
  }
  else {
    if (uVar37 < uVar38) goto LAB_00140d9f;
    if (uVar4 < uVar35) goto LAB_00140dbe;
    if (uVar30 < uVar39) goto LAB_00140ddd;
    puVar44 = (ulong *)((long)src + (ulong)(iVar29 == iVar19));
    if (uVar30 < uVar40) goto LAB_00140dfc;
    if (puVar44 < puVar21) {
      bVar18 = 0x20 - cVar13;
      puVar1 = iEnd + -4;
      do {
        uVar35 = (uint)((int)*puVar44 * -0x61c8864f) >> (bVar18 & 0x1f);
        uVar25 = (long)puVar44 - (long)pBVar9;
        uVar20 = pUVar8[uVar35];
        uVar46 = (ulong)uVar20;
        UVar43 = (U32)uVar25;
        uVar30 = (UVar43 - uVar39) + 1;
        piVar33 = (int *)(pBVar9 + uVar30);
        if (uVar30 < uVar4) {
          piVar33 = (int *)(pBVar10 + (uVar30 - uVar28));
        }
        pUVar8[uVar35] = UVar43;
        if (((uVar4 - 1) - uVar30 < 3) || (*piVar33 != *(int *)((long)puVar44 + 1))) {
          puVar45 = puVar44;
          if (uVar20 <= uVar4) {
            uVar20 = pUVar11[(uint)((int)*puVar44 * -0x61c8864f) >> (0x20U - cVar14 & 0x1f)];
            if ((uVar20 <= uVar5) || (*(int *)(pBVar10 + uVar20) != (int)*puVar44))
            goto LAB_0014056e;
            sVar16 = ZSTD_count_2segments
                               ((BYTE *)((long)puVar44 + 4),(BYTE *)((long)(pBVar10 + uVar20) + 4),
                                (BYTE *)iEnd,(BYTE *)mEnd,iStart);
            lVar31 = sVar16 + 4;
            if (puVar27 < puVar44) {
              pBVar17 = pBVar10 + ((ulong)uVar20 - 1);
              do {
                puVar23 = (ulong *)((long)puVar44 + -1);
                puVar45 = puVar44;
                if ((*(BYTE *)puVar23 != *pBVar17) ||
                   (lVar31 = lVar31 + 1, puVar45 = puVar23, pBVar17 <= pBVar22)) break;
                pBVar17 = pBVar17 + -1;
                puVar44 = puVar23;
              } while (puVar27 < puVar23);
            }
            if ((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3) <
                seqStore->maxNbSeq) {
              if (seqStore->maxNbLit < 0x20001) {
                uVar46 = (long)puVar45 - (long)puVar27;
                puVar44 = (ulong *)seqStore->lit;
                if ((BYTE *)((long)puVar44 + uVar46) <= seqStore->litStart + seqStore->maxNbLit) {
                  if (puVar45 <= iEnd) {
                    if (puVar1 < puVar45) {
                      ZSTD_safecopyLiterals
                                ((BYTE *)puVar44,(BYTE *)puVar27,(BYTE *)puVar45,(BYTE *)puVar1);
LAB_001408ca:
                      seqStore->lit = seqStore->lit + uVar46;
                      if (0xffff < uVar46) {
                        if (seqStore->longLengthID != 0) goto LAB_00140d23;
                        seqStore->longLengthID = 1;
                        seqStore->longLengthPos =
                             (U32)((ulong)((long)seqStore->sequences -
                                          (long)seqStore->sequencesStart) >> 3);
                      }
                    }
                    else {
                      uVar36 = puVar27[1];
                      *puVar44 = *puVar27;
                      puVar44[1] = uVar36;
                      pBVar17 = seqStore->lit;
                      if (0x10 < uVar46) {
                        lVar32 = (long)(pBVar17 + 0x10) - (long)(puVar27 + 2);
                        if (lVar32 < 8) {
                          if (-0x10 < lVar32) goto LAB_00140d42;
                        }
                        else if (0xffffffffffffffe0 < lVar32 - 0x10U) goto LAB_00140d61;
                        uVar36 = puVar27[3];
                        *(ulong *)(pBVar17 + 0x10) = puVar27[2];
                        *(ulong *)(pBVar17 + 0x18) = uVar36;
                        if (0x20 < (long)uVar46) {
                          lVar32 = 0;
                          do {
                            puVar3 = (undefined8 *)((long)puVar27 + lVar32 + 0x20);
                            uVar12 = puVar3[1];
                            pBVar2 = pBVar17 + lVar32 + 0x20;
                            *(undefined8 *)pBVar2 = *puVar3;
                            *(undefined8 *)(pBVar2 + 8) = uVar12;
                            puVar3 = (undefined8 *)((long)puVar27 + lVar32 + 0x30);
                            uVar12 = puVar3[1];
                            *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
                            *(undefined8 *)(pBVar2 + 0x18) = uVar12;
                            lVar32 = lVar32 + 0x20;
                          } while (pBVar2 + 0x20 < pBVar17 + uVar46);
                        }
                        goto LAB_001408ca;
                      }
                      seqStore->lit = pBVar17 + uVar46;
                    }
                    uVar20 = UVar43 - (uVar20 + uVar28);
                    uVar36 = lVar31 - 3;
                    psVar42 = seqStore->sequences;
                    psVar42->litLength = (U16)uVar46;
                    psVar42->offset = uVar20 + 3;
                    uVar40 = uVar39;
                    if (uVar36 < 0x10000) goto LAB_00140a02;
                    UVar6 = seqStore->longLengthID;
joined_r0x001409db:
                    uVar40 = uVar39;
                    if (UVar6 == 0) goto LAB_001409e1;
                    goto LAB_00140ce5;
                  }
                  goto LAB_00140ca7;
                }
                goto LAB_00140c88;
              }
              goto LAB_00140cc6;
            }
            goto LAB_00140c69;
          }
          piVar33 = (int *)(pBVar9 + uVar46);
          if (*piVar33 == (int)*puVar44) {
            puVar23 = (ulong *)((long)puVar44 + 4);
            puVar24 = (ulong *)(piVar33 + 1);
            puVar26 = puVar23;
            if (puVar23 < (ulong *)((long)iEnd - 7U)) {
              if (*puVar24 == *puVar23) {
                lVar31 = 0;
                do {
                  puVar24 = (ulong *)((long)puVar44 + lVar31 + 0xc);
                  if ((ulong *)((long)iEnd - 7U) <= puVar24) {
                    puVar24 = (ulong *)(pBVar9 + lVar31 + uVar46 + 0xc);
                    puVar26 = (ulong *)((long)puVar44 + lVar31 + 0xc);
                    goto LAB_00140691;
                  }
                  lVar32 = lVar31 + uVar46 + 0xc;
                  uVar36 = *puVar24;
                  lVar31 = lVar31 + 8;
                } while (*(ulong *)(pBVar9 + lVar32) == uVar36);
                uVar36 = uVar36 ^ *(ulong *)(pBVar9 + lVar32);
                uVar34 = 0;
                if (uVar36 != 0) {
                  for (; (uVar36 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
                  }
                }
                uVar36 = (uVar34 >> 3 & 0x1fffffff) + lVar31;
              }
              else {
                uVar34 = *puVar23 ^ *puVar24;
                uVar36 = 0;
                if (uVar34 != 0) {
                  for (; (uVar34 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
                  }
                }
                uVar36 = uVar36 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_00140691:
              if ((puVar26 < (ulong *)((long)iEnd - 3U)) && ((int)*puVar24 == (int)*puVar26)) {
                puVar26 = (ulong *)((long)puVar26 + 4);
                puVar24 = (ulong *)((long)puVar24 + 4);
              }
              if ((puVar26 < (ulong *)((long)iEnd + -1)) && ((short)*puVar24 == (short)*puVar26)) {
                puVar26 = (ulong *)((long)puVar26 + 2);
                puVar24 = (ulong *)((long)puVar24 + 2);
              }
              if (puVar26 < iEnd) {
                puVar26 = (ulong *)((long)puVar26 + (ulong)((BYTE)*puVar24 == (BYTE)*puVar26));
              }
              uVar36 = (long)puVar26 - (long)puVar23;
            }
            lVar31 = uVar36 + 4;
            if (puVar27 < puVar44) {
              pBVar17 = pBVar9 + (uVar46 - 1);
              do {
                puVar23 = (ulong *)((long)puVar45 + -1);
                if ((*(BYTE *)puVar23 != *pBVar17) ||
                   (lVar31 = lVar31 + 1, puVar45 = puVar23, pBVar17 <= iStart)) break;
                pBVar17 = pBVar17 + -1;
              } while (puVar27 < puVar23);
            }
            if ((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3) <
                seqStore->maxNbSeq) {
              if (seqStore->maxNbLit < 0x20001) {
                uVar46 = (long)puVar45 - (long)puVar27;
                puVar23 = (ulong *)seqStore->lit;
                if ((BYTE *)((long)puVar23 + uVar46) <= seqStore->litStart + seqStore->maxNbLit) {
                  if (puVar45 <= iEnd) {
                    if (puVar1 < puVar45) {
                      ZSTD_safecopyLiterals
                                ((BYTE *)puVar23,(BYTE *)puVar27,(BYTE *)puVar45,(BYTE *)puVar1);
LAB_00140798:
                      seqStore->lit = seqStore->lit + uVar46;
                      if (0xffff < uVar46) {
                        if (seqStore->longLengthID != 0) goto LAB_00140d23;
                        seqStore->longLengthID = 1;
                        seqStore->longLengthPos =
                             (U32)((ulong)((long)seqStore->sequences -
                                          (long)seqStore->sequencesStart) >> 3);
                      }
                    }
                    else {
                      uVar36 = puVar27[1];
                      *puVar23 = *puVar27;
                      puVar23[1] = uVar36;
                      pBVar17 = seqStore->lit;
                      if (0x10 < uVar46) {
                        lVar32 = (long)(pBVar17 + 0x10) - (long)(puVar27 + 2);
                        if (lVar32 < 8) {
                          if (-0x10 < lVar32) goto LAB_00140d42;
                        }
                        else if (0xffffffffffffffe0 < lVar32 - 0x10U) goto LAB_00140d61;
                        uVar36 = puVar27[3];
                        *(ulong *)(pBVar17 + 0x10) = puVar27[2];
                        *(ulong *)(pBVar17 + 0x18) = uVar36;
                        if (0x20 < (long)uVar46) {
                          lVar32 = 0;
                          do {
                            puVar3 = (undefined8 *)((long)puVar27 + lVar32 + 0x20);
                            uVar12 = puVar3[1];
                            pBVar2 = pBVar17 + lVar32 + 0x20;
                            *(undefined8 *)pBVar2 = *puVar3;
                            *(undefined8 *)(pBVar2 + 8) = uVar12;
                            puVar3 = (undefined8 *)((long)puVar27 + lVar32 + 0x30);
                            uVar12 = puVar3[1];
                            *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
                            *(undefined8 *)(pBVar2 + 0x18) = uVar12;
                            lVar32 = lVar32 + 0x20;
                          } while (pBVar2 + 0x20 < pBVar17 + uVar46);
                        }
                        goto LAB_00140798;
                      }
                      seqStore->lit = pBVar17 + uVar46;
                    }
                    uVar20 = (int)puVar44 - (int)piVar33;
                    uVar36 = lVar31 - 3;
                    psVar42 = seqStore->sequences;
                    psVar42->litLength = (U16)uVar46;
                    psVar42->offset = uVar20 + 3;
                    uVar40 = uVar39;
                    if (0xffff < uVar36) {
                      UVar6 = seqStore->longLengthID;
                      goto joined_r0x001409db;
                    }
                    goto LAB_00140a02;
                  }
                  goto LAB_00140ca7;
                }
                goto LAB_00140c88;
              }
              goto LAB_00140cc6;
            }
            goto LAB_00140c69;
          }
LAB_0014056e:
          puVar44 = (ulong *)((long)puVar44 + ((long)puVar44 - (long)puVar27 >> 8) + (ulong)uVar15);
        }
        else {
          puVar45 = iEnd;
          if (uVar30 < uVar4) {
            puVar45 = mEnd;
          }
          sVar16 = ZSTD_count_2segments
                             ((BYTE *)((long)puVar44 + 5),(BYTE *)(piVar33 + 1),(BYTE *)iEnd,
                              (BYTE *)puVar45,iStart);
          if (seqStore->maxNbSeq <=
              (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
          goto LAB_00140c69;
          if (0x20000 < seqStore->maxNbLit) goto LAB_00140cc6;
          puVar45 = (ulong *)((long)puVar44 + 1);
          uVar46 = (long)puVar45 - (long)puVar27;
          puVar44 = (ulong *)seqStore->lit;
          if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar44 + uVar46))
          goto LAB_00140c88;
          if (iEnd < puVar45) goto LAB_00140ca7;
          if (puVar1 < puVar45) {
            ZSTD_safecopyLiterals((BYTE *)puVar44,(BYTE *)puVar27,(BYTE *)puVar45,(BYTE *)puVar1);
LAB_001403dd:
            seqStore->lit = seqStore->lit + uVar46;
            if (0xffff < uVar46) {
              if (seqStore->longLengthID != 0) goto LAB_00140d23;
              seqStore->longLengthID = 1;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
            }
          }
          else {
            uVar36 = puVar27[1];
            *puVar44 = *puVar27;
            puVar44[1] = uVar36;
            pBVar17 = seqStore->lit;
            if (0x10 < uVar46) {
              lVar31 = (long)(pBVar17 + 0x10) - (long)(puVar27 + 2);
              if (lVar31 < 8) {
                if (-0x10 < lVar31) goto LAB_00140d42;
              }
              else if (0xffffffffffffffe0 < lVar31 - 0x10U) goto LAB_00140d61;
              uVar36 = puVar27[3];
              *(ulong *)(pBVar17 + 0x10) = puVar27[2];
              *(ulong *)(pBVar17 + 0x18) = uVar36;
              if (0x20 < (long)uVar46) {
                lVar31 = 0;
                do {
                  puVar3 = (undefined8 *)((long)puVar27 + lVar31 + 0x20);
                  uVar12 = puVar3[1];
                  pBVar2 = pBVar17 + lVar31 + 0x20;
                  *(undefined8 *)pBVar2 = *puVar3;
                  *(undefined8 *)(pBVar2 + 8) = uVar12;
                  puVar3 = (undefined8 *)((long)puVar27 + lVar31 + 0x30);
                  uVar12 = puVar3[1];
                  *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
                  *(undefined8 *)(pBVar2 + 0x18) = uVar12;
                  lVar31 = lVar31 + 0x20;
                } while (pBVar2 + 0x20 < pBVar17 + uVar46);
              }
              goto LAB_001403dd;
            }
            seqStore->lit = pBVar17 + uVar46;
          }
          lVar31 = sVar16 + 4;
          uVar36 = sVar16 + 1;
          psVar42 = seqStore->sequences;
          psVar42->litLength = (U16)uVar46;
          psVar42->offset = 1;
          uVar20 = uVar39;
          if (0xffff < uVar36) {
            if (seqStore->longLengthID != 0) goto LAB_00140ce5;
LAB_001409e1:
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar42 - (long)seqStore->sequencesStart) >> 3);
          }
LAB_00140a02:
          uVar39 = uVar20;
          puVar27 = (ulong *)(lVar31 + (long)puVar45);
          psVar42->matchLength = (U16)uVar36;
          psVar42 = psVar42 + 1;
          seqStore->sequences = psVar42;
          puVar44 = puVar27;
          if (puVar27 <= puVar21) {
            if (pBVar9 + (uVar25 & 0xffffffff) + 2 <= src) goto LAB_00140d04;
            pUVar8[(uint)(*(int *)(pBVar9 + (uVar25 & 0xffffffff) + 2) * -0x61c8864f) >>
                   (bVar18 & 0x1f)] = UVar43 + 2;
            pUVar8[(uint)(*(int *)((long)puVar27 + -2) * -0x61c8864f) >> (bVar18 & 0x1f)] =
                 ((int)puVar27 + -2) - iVar41;
            do {
              uVar30 = uVar39;
              UVar43 = (int)puVar27 - iVar41;
              uVar20 = UVar43 - uVar40;
              pBVar17 = pBVar9;
              if (uVar20 < uVar4) {
                pBVar17 = pBVar10 + -(ulong)uVar28;
              }
              puVar44 = puVar27;
              uVar39 = uVar30;
              if (((uVar4 - 1) - uVar20 < 3) || (*(int *)(pBVar17 + uVar20) != (int)*puVar27))
              break;
              puVar44 = iEnd;
              if (uVar20 < uVar4) {
                puVar44 = mEnd;
              }
              sVar16 = ZSTD_count_2segments
                                 ((BYTE *)((long)puVar27 + 4),(BYTE *)((long)(pBVar17 + uVar20) + 4)
                                  ,(BYTE *)iEnd,(BYTE *)puVar44,iStart);
              if (seqStore->maxNbSeq <= (ulong)((long)psVar42 - (long)seqStore->sequencesStart >> 3)
                 ) goto LAB_00140c69;
              if (0x20000 < seqStore->maxNbLit) goto LAB_00140cc6;
              puVar44 = (ulong *)seqStore->lit;
              if (seqStore->litStart + seqStore->maxNbLit < puVar44) goto LAB_00140c88;
              if (iEnd < puVar27) goto LAB_00140ca7;
              if (puVar1 < puVar27) {
                ZSTD_safecopyLiterals
                          ((BYTE *)puVar44,(BYTE *)puVar27,(BYTE *)puVar27,(BYTE *)puVar1);
              }
              else {
                uVar46 = puVar27[1];
                *puVar44 = *puVar27;
                puVar44[1] = uVar46;
              }
              psVar42 = seqStore->sequences;
              psVar42->litLength = 0;
              psVar42->offset = 1;
              if (0xffff < sVar16 + 1) {
                if (seqStore->longLengthID != 0) goto LAB_00140ce5;
                seqStore->longLengthID = 2;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar42 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar42->matchLength = (U16)(sVar16 + 1);
              psVar42 = psVar42 + 1;
              seqStore->sequences = psVar42;
              pUVar8[(uint)((int)*puVar27 * -0x61c8864f) >> (bVar18 & 0x1f)] = UVar43;
              puVar27 = (ulong *)((long)puVar27 + sVar16 + 4);
              puVar44 = puVar27;
              uVar39 = uVar40;
              uVar40 = uVar30;
            } while (puVar27 <= puVar21);
          }
        }
      } while (puVar44 < puVar21);
    }
  }
  *rep = uVar39;
  rep[1] = uVar40;
  return (long)iEnd - (long)puVar27;
}

Assistant:

size_t ZSTD_compressBlock_fast_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    U32 const mls = ms->cParams.minMatch;
    assert(ms->dictMatchState != NULL);
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_fast_dictMatchState_generic(ms, seqStore, rep, src, srcSize, 4);
    case 5 :
        return ZSTD_compressBlock_fast_dictMatchState_generic(ms, seqStore, rep, src, srcSize, 5);
    case 6 :
        return ZSTD_compressBlock_fast_dictMatchState_generic(ms, seqStore, rep, src, srcSize, 6);
    case 7 :
        return ZSTD_compressBlock_fast_dictMatchState_generic(ms, seqStore, rep, src, srcSize, 7);
    }
}